

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-rst.c
# Opt level: O0

void read_cb(uv_stream_t *tcp,ssize_t nread,uv_buf_t *buf)

{
  int64_t eval_b_1;
  int64_t eval_a_1;
  void *eval_b;
  void *eval_a;
  uv_buf_t *buf_local;
  ssize_t nread_local;
  uv_stream_t *tcp_local;
  
  if (tcp == (uv_stream_t *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-writealot.c"
            ,0x55,"tcp","!=","NULL",0,"!=",0);
    abort();
  }
  if (nread < 0) {
    if (nread != -0xfff) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-writealot.c"
              ,0x5b,"nread","==","UV_EOF",nread,"==",0xfffffffffffff001);
      abort();
    }
    printf("GOT EOF\n");
    uv_close((uv_handle_t *)tcp,close_cb);
  }
  else {
    bytes_received_done = nread + bytes_received_done;
  }
  free(buf->base);
  return;
}

Assistant:

static void read_cb(uv_stream_t* t, ssize_t nread, const uv_buf_t* buf) {
  ASSERT_PTR_EQ((uv_tcp_t*) t, &tcp);
  ASSERT_EQ(nread, UV_ECONNRESET);

  uv_os_fd_t fd;
  ASSERT_OK(uv_fileno((uv_handle_t*) t, &fd));
  uv_handle_type type = uv_guess_handle(fd);
  ASSERT_EQ(type, UV_TCP);

  uv_close((uv_handle_t *) t, close_cb);
  free(buf->base);
}